

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::AddPsbtDataRequest,cfd::js::api::json::PsbtOutputData,cfd::js::api::AddPsbtDataRequestStruct,cfd::js::api::PsbtOutputDataStruct>
          (json *this,string *request_message,
          function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::AddPsbtDataRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_580;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_4c8 [4];
  JsonClassBase<cfd::js::api::json::PsbtOutputData> local_4a8 [4];
  undefined1 local_488 [8];
  PsbtOutputData res_2;
  undefined1 local_408 [8];
  PsbtOutputDataStruct response;
  AddPsbtDataRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_b8 [8];
  AddPsbtDataRequest req;
  function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::AddPsbtDataRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req.outputs_.super_JsonVector<cfd::js::api::json::PsbtAddOutputRequest>.
  super_vector<cfd::js::api::json::PsbtAddOutputRequest,_std::allocator<cfd::js::api::json::PsbtAddOutputRequest>_>
  .
  super__Vector_base<cfd::js::api::json::PsbtAddOutputRequest,_std::allocator<cfd::js::api::json::PsbtAddOutputRequest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)call_function;
  AddPsbtDataRequest::AddPsbtDataRequest((AddPsbtDataRequest *)local_b8);
  core::JsonClassBase<cfd::js::api::json::AddPsbtDataRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::AddPsbtDataRequest> *)local_b8,request_message);
  AddPsbtDataRequest::ConvertToStruct
            ((AddPsbtDataRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AddPsbtDataRequest *)local_b8);
  std::function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::AddPsbtDataRequestStruct_&)>
  ::operator()((PsbtOutputDataStruct *)local_408,call_function,
               (AddPsbtDataRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._119_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._56_4_ == 0) {
    PsbtOutputData::PsbtOutputData((PsbtOutputData *)local_488);
    PsbtOutputData::ConvertFromStruct((PsbtOutputData *)local_488,(PsbtOutputDataStruct *)local_408)
    ;
    core::JsonClassBase<cfd::js::api::json::PsbtOutputData>::Serialize_abi_cxx11_(local_4a8);
    std::__cxx11::string::operator=((string *)this,(string *)local_4a8);
    std::__cxx11::string::~string((string *)local_4a8);
    PsbtOutputData::~PsbtOutputData((PsbtOutputData *)local_488);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_580,(InnerErrorResponseStruct *)&response.field_0x38);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_4c8);
    std::__cxx11::string::operator=((string *)this,(string *)local_4c8);
    std::__cxx11::string::~string((string *)local_4c8);
    ErrorResponse::~ErrorResponse(&local_580);
  }
  res_2._119_1_ = 1;
  PsbtOutputDataStruct::~PsbtOutputDataStruct((PsbtOutputDataStruct *)local_408);
  AddPsbtDataRequestStruct::~AddPsbtDataRequestStruct
            ((AddPsbtDataRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  AddPsbtDataRequest::~AddPsbtDataRequest((AddPsbtDataRequest *)local_b8);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}